

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool isNewLine(shared_ptr<Readable> *reader,size_t i)

{
  element_type *peVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = (*((reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Readable[2])();
  bVar3 = true;
  if ((char)iVar2 != '\n') {
    peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,i);
    if ((char)iVar2 != '\r') {
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,i);
      if ((char)iVar2 == '\r') {
        peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,i + 1);
        bVar3 = (char)iVar2 == '\n';
      }
      else {
        bVar3 = false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool isNewLine(const std::shared_ptr<Readable>& reader, std::size_t i) {
  return
    reader->charAt(i) == '\n'
    || reader->charAt(i) == '\r'
    || (reader->charAt(i) == '\r' && reader->charAt(i + 1) == '\n');
}